

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

int sexp_maybe_block_output_port(sexp ctx,sexp out)

{
  sexp psVar1;
  int iVar2;
  int iVar3;
  
  psVar1 = (out->value).type.getters;
  iVar3 = 0;
  if (psVar1 != (sexp)0x0) {
    iVar2 = fileno((FILE *)psVar1);
    iVar3 = 0;
    if (-1 < iVar2) {
      if ((out->value).type.finalize_name == (sexp)0xffffffffffffffff) {
        psVar1 = (out->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar1 = (out->value).type.slots;
          iVar2 = -1;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar2 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar2 = fileno((FILE *)psVar1);
        }
        iVar2 = fcntl(iVar2,3);
        *(long *)((long)&out->value + 0x40) = (long)iVar2;
      }
      if (((out->value).flonum_bits[0x41] & 8U) != 0) {
        (out->value).flonum_bits[0x2e] = '\x01';
        psVar1 = (out->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar1 = (out->value).type.slots;
          iVar3 = -1;
          if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
            iVar3 = (psVar1->value).promise.donep;
          }
        }
        else {
          iVar3 = fileno((FILE *)psVar1);
        }
        fcntl(iVar3,4,(out->value).port.flags & 0xfffffffffffff7ff);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int sexp_maybe_block_output_port (sexp ctx, sexp out) {
  if (sexp_port_stream(out) && sexp_port_fileno(out) >= 0) {
    if (sexp_port_flags(out) == SEXP_PORT_UNKNOWN_FLAGS)
      sexp_port_flags(out) = fcntl(sexp_port_fileno(out), F_GETFL);
    if (sexp_port_flags(out) & O_NONBLOCK) {
      sexp_port_blockedp(out) = 1;
      fcntl(sexp_port_fileno(out), F_SETFL, sexp_port_flags(out) & ~O_NONBLOCK);
      return 1;
    }
  }
  return 0;
}